

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

int __thiscall Fl_Tree_Item::remove_child(Fl_Tree_Item *this,Fl_Tree_Item *item)

{
  Fl_Tree_Item **ppFVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = (ulong)(this->_children)._total;
  iVar4 = -1;
  if (0 < (long)uVar3) {
    ppFVar1 = (this->_children)._items;
    if (*ppFVar1 == item) {
      uVar6 = 0;
      iVar4 = 0;
    }
    else {
      uVar5 = 0;
      do {
        if (uVar3 - 1 == uVar5) {
          return -1;
        }
        uVar6 = uVar5 + 1;
        lVar2 = uVar5 + 1;
        uVar5 = uVar6;
      } while (ppFVar1[lVar2] != item);
      iVar4 = (uVar6 < uVar3) - 1;
    }
    Fl_Tree_Item_Array::clear(&item->_children);
    Fl_Tree_Item_Array::remove(&this->_children,(char *)(uVar6 & 0xffffffff));
  }
  return iVar4;
}

Assistant:

int Fl_Tree_Item::remove_child(Fl_Tree_Item *item) {
  for ( int t=0; t<children(); t++ ) {
    if ( child(t) == item ) {
      item->clear_children();
      _children.remove(t);
      recalc_tree();		// may change tree geometry
      return(0);
    }
  }
  return(-1);
}